

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O3

bool __thiscall
vkt::shaderexecutor::InputLess<tcu::Matrix<float,_2,_2>_>::operator()
          (InputLess<tcu::Matrix<float,_2,_2>_> *this,Matrix<float,_2,_2> *mat1,
          Matrix<float,_2,_2> *mat2)

{
  Vector<float,_2> *val1;
  Vector<float,_2> *val2;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  long lVar4;
  bool bVar5;
  
  bVar5 = false;
  lVar4 = 0;
  do {
    val1 = (mat1->m_data).m_data + lVar4;
    val2 = (mat2->m_data).m_data + lVar4;
    bVar2 = inputLess<tcu::Vector<float,2>>(val1,val2);
    if (bVar2) {
      bVar3 = true;
      break;
    }
    bVar3 = inputLess<tcu::Vector<float,2>>(val2,val1);
    lVar4 = 1;
    bVar1 = !bVar5;
    bVar5 = true;
  } while (bVar1 && !bVar3);
  return (bool)(bVar3 & bVar2);
}

Assistant:

bool operator() (const Matrix<T, Rows, Cols>& mat1,
					 const Matrix<T, Rows, Cols>& mat2) const
	{
		for (int col = 0; col < Cols; ++col)
		{
			if (inputLess(mat1[col], mat2[col]))
				return true;
			if (inputLess(mat2[col], mat1[col]))
				return false;
		}

		return false;
	}